

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::CommandLineInterface::Run
          (CommandLineInterface *this,int argc,char **argv)

{
  string *filename;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  char *pcVar1;
  GeneratorContextImpl *this_01;
  bool bVar2;
  ParseArgumentStatus PVar3;
  ssize_t sVar4;
  long lVar5;
  FileDescriptor *pFVar6;
  iterator iVar7;
  ostream *poVar8;
  pointer pOVar9;
  mapped_type *ppGVar10;
  mapped_type pGVar11;
  Type *this_02;
  LogMessage *pLVar12;
  _Rb_tree_header *p_Var13;
  ulong uVar14;
  pointer ppVar15;
  int iVar16;
  size_type sVar17;
  pointer pbVar18;
  char *pcVar19;
  ulong uVar20;
  __node_base _Var21;
  long lVar22;
  bool bVar23;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  GeneratorContextMap output_directories;
  ErrorPrinter error_collector;
  Importer importer;
  DiskSourceTree source_tree;
  char buffer [4096];
  LogFinisher local_1289;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_1288;
  undefined1 local_1268 [104];
  long *local_1200;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  local_11f8;
  long local_11f0 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_11e0;
  string *local_11a8;
  MultiFileErrorCollector local_11a0;
  ErrorCollector local_1198;
  ErrorFormat local_1190;
  DiskSourceTree *local_1188;
  char local_1180;
  undefined1 local_1178 [96];
  DescriptorPool local_1118;
  DiskSourceTree local_10b0;
  LogMessage local_1070;
  undefined1 local_1038 [32];
  _Alloc_hider local_1018;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1008 [253];
  
  Clear(this);
  PVar3 = ParseArguments(this,argc,argv);
  if (PVar3 == PARSE_ARGUMENT_DONE_AND_EXIT) {
    return 0;
  }
  if (PVar3 == PARSE_ARGUMENT_FAIL) {
    return 1;
  }
  local_1178._8_8_ = (SourceTree *)0x0;
  local_1178[0x10] = '\0';
  local_1178._0_8_ = local_1178 + 0x10;
  sVar4 = readlink("/proc/self/exe",local_1038,0x1000);
  if (0 < (int)sVar4) {
    std::__cxx11::string::_M_replace((ulong)local_1178,0,(char *)local_1178._8_8_,(ulong)local_1038)
    ;
    lVar5 = std::__cxx11::string::find_last_of(local_1178,0x354045,0xffffffffffffffff);
    if (1 < lVar5 + 1U) {
      std::__cxx11::string::substr((ulong)local_1038,(ulong)local_1178);
      std::__cxx11::string::operator=((string *)local_1178,(string *)local_1038);
      pcVar1 = local_1038 + 0x10;
      if ((char *)local_1038._0_8_ != pcVar1) {
        operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
      }
      bVar2 = anon_unknown_0::IsInstalledProtoPath((string *)local_1178);
      this_00 = &this->proto_path_;
      if (bVar2) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1038,(char (*) [1])0x357dff,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1178);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)this_00,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1038);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1018._M_p != local_1008) {
          operator_delete(local_1018._M_p,local_1008[0]._M_allocated_capacity + 1);
        }
        sVar17 = local_1038._16_8_;
        pcVar19 = (char *)local_1038._0_8_;
        if ((char *)local_1038._0_8_ != pcVar1) {
LAB_002048a1:
          operator_delete(pcVar19,sVar17 + 1);
        }
      }
      else {
        local_1038._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1038,local_1178._0_8_,
                   (pointer)(local_1178._0_8_ + (long)(_func_int ***)local_1178._8_8_));
        std::__cxx11::string::append(local_1038);
        bVar2 = anon_unknown_0::IsInstalledProtoPath((string *)local_1038);
        if ((char *)local_1038._0_8_ != pcVar1) {
          operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
        }
        if (bVar2) {
          local_1268._0_8_ = local_1268 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1268,local_1178._0_8_,
                     (pointer)(local_1178._0_8_ + (long)(_func_int ***)local_1178._8_8_));
          std::__cxx11::string::append(local_1268);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1038,(char (*) [1])0x357dff,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1268
                    );
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)this_00,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1038);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1018._M_p != local_1008) {
            operator_delete(local_1018._M_p,local_1008[0]._M_allocated_capacity + 1);
          }
          if ((char *)local_1038._0_8_ != pcVar1) {
            operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
          }
          if ((undefined1 *)local_1268._0_8_ != local_1268 + 0x10) {
            operator_delete((void *)local_1268._0_8_,local_1268._16_8_ + 1);
          }
        }
        else {
          lVar5 = std::__cxx11::string::find_last_of(local_1178,0x354045,0xffffffffffffffff);
          if (1 < lVar5 + 1U) {
            std::__cxx11::string::substr((ulong)local_1038,(ulong)local_1178);
            std::__cxx11::string::operator=((string *)local_1178,(string *)local_1038);
            if ((char *)local_1038._0_8_ != pcVar1) {
              operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
            }
            local_1038._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1038,local_1178._0_8_,
                       (pointer)(local_1178._0_8_ + (long)(_func_int ***)local_1178._8_8_));
            std::__cxx11::string::append(local_1038);
            bVar2 = anon_unknown_0::IsInstalledProtoPath((string *)local_1038);
            if ((char *)local_1038._0_8_ != pcVar1) {
              operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
            }
            if (bVar2) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1268,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1178,"/include");
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_1038,(char (*) [1])0x357dff,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1268);
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)this_00,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_1038);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1038);
              sVar17 = local_1268._16_8_;
              pcVar19 = (char *)local_1268._0_8_;
              if ((undefined1 *)local_1268._0_8_ != local_1268 + 0x10) goto LAB_002048a1;
            }
          }
        }
      }
    }
  }
  if ((undefined1 *)local_1178._0_8_ != local_1178 + 0x10) {
    operator_delete((void *)local_1178._0_8_,CONCAT71(local_1178._17_7_,local_1178[0x10]) + 1);
  }
  DiskSourceTree::DiskSourceTree(&local_10b0);
  ppVar15 = (this->proto_path_).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar15) {
    lVar5 = 0x20;
    uVar20 = 0;
    do {
      DiskSourceTree::MapPath
                (&local_10b0,(string *)((long)ppVar15 + lVar5 + -0x20),
                 (string *)((long)&(ppVar15->first)._M_dataplus._M_p + lVar5));
      uVar20 = uVar20 + 1;
      ppVar15 = (this->proto_path_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x40;
    } while (uVar20 < (ulong)((long)(this->proto_path_).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar15 >> 6)
            );
  }
  if (this->inputs_are_proto_path_relative_ == false) {
    bVar2 = MakeInputsBeProtoPathRelative(this,&local_10b0);
    iVar16 = 1;
    if (!bVar2) goto LAB_00205569;
  }
  local_1190 = this->error_format_;
  local_11a0._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_00425d20;
  local_1198._vptr_ErrorCollector = (_func_int **)&PTR__ErrorPrinter_00425d60;
  local_1180 = '\0';
  local_1188 = &local_10b0;
  Importer::Importer((Importer *)local_1178,&local_10b0.super_SourceTree,&local_11a0);
  local_1288.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (FileDescriptor **)0x0;
  local_1288.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (FileDescriptor **)0x0;
  local_1288.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (FileDescriptor **)0x0;
  pbVar18 = (this->input_files_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->input_files_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar18) {
    local_11a8 = &this->direct_dependencies_violation_msg_;
    uVar20 = 0;
    do {
      Importer::AddUnusedImportTrackFile((Importer *)local_1178,pbVar18 + uVar20);
      local_11e0._M_buckets =
           (__buckets_ptr)
           Importer::Import((Importer *)local_1178,
                            (this->input_files_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar20);
      Importer::ClearUnusedImportTrackFiles((Importer *)local_1178);
      if ((FileDescriptor *)local_11e0._M_buckets == (FileDescriptor *)0x0) {
LAB_0020535a:
        iVar16 = 1;
        goto LAB_0020552b;
      }
      if (local_1288.
          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1288.
          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FileDescriptor_const*const&>
                  ((vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
                    *)&local_1288,
                   (iterator)
                   local_1288.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(FileDescriptor **)&local_11e0);
      }
      else {
        *local_1288.
         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = (FileDescriptor *)local_11e0._M_buckets;
        local_1288.
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1288.
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if ((this->disallow_services_ == true) && (0 < *(int *)((long)local_11e0._M_buckets + 0x78)))
      {
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,*(char **)*local_11e0._M_buckets,
                            *(long *)(*local_11e0._M_buckets + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,": This file contains services, but --disallow_services was used.",0x40);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        goto LAB_0020535a;
      }
      if ((this->direct_dependencies_explicitly_set_ == true) &&
         (0 < *(int *)((long)local_11e0._M_buckets + 0x18))) {
        iVar16 = 0;
        bVar2 = false;
        do {
          pFVar6 = FileDescriptor::dependency((FileDescriptor *)local_11e0._M_buckets,iVar16);
          iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&(this->direct_dependencies_)._M_t,*(key_type **)pFVar6);
          if ((_Rb_tree_header *)iVar7._M_node ==
              &(this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header) {
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,*(char **)*local_11e0._M_buckets,
                                *(long *)(*local_11e0._M_buckets + 1));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
            local_1268._0_8_ = local_1268 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1268,"%s","");
            pFVar6 = FileDescriptor::dependency((FileDescriptor *)local_11e0._M_buckets,iVar16);
            StringReplace((string *)local_1038,local_11a8,(string *)local_1268,*(string **)pFVar6,
                          true);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)local_1038._0_8_,local_1038._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            if ((undefined1 *)local_1038._0_8_ != local_1038 + 0x10) {
              operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
            }
            if ((undefined1 *)local_1268._0_8_ != local_1268 + 0x10) {
              operator_delete((void *)local_1268._0_8_,local_1268._16_8_ + 1);
            }
            bVar2 = true;
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 < *(int *)((long)local_11e0._M_buckets + 0x18));
        if (bVar2) goto LAB_0020535a;
      }
      uVar20 = uVar20 + 1;
      pbVar18 = (this->input_files_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(this->input_files_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18 >> 5)
            );
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_11e0,0,
               (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1038,(key_equal *)local_1268,(allocator_type *)&local_1070);
  if ((this->mode_ == MODE_COMPILE) &&
     (pOVar9 = (this->output_directives_).
               super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->output_directives_).
     super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
     ._M_impl.super__Vector_impl_data._M_finish != pOVar9)) {
    lVar5 = 0;
    uVar20 = 0;
    do {
      local_1038._0_8_ = local_1038 + 0x10;
      lVar22 = *(long *)((long)&(pOVar9->output_location)._M_dataplus._M_p + lVar5);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1038,lVar22,
                 *(long *)((long)&(pOVar9->output_location)._M_string_length + lVar5) + lVar22);
      local_1268._0_8_ = local_1268 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1268,".zip","");
      if ((ulong)local_1038._8_8_ < (ulong)local_1268._8_8_) {
        bVar2 = false;
      }
      else {
        iVar16 = std::__cxx11::string::compare
                           ((ulong)local_1038,local_1038._8_8_ - local_1268._8_8_,
                            (string *)local_1268._8_8_);
        bVar2 = iVar16 == 0;
      }
      if (bVar2) {
        bVar23 = false;
      }
      else {
        local_1200 = local_11f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1200,".jar","");
        bVar23 = true;
        if (local_11f8.ptr_ <= (ulong)local_1038._8_8_) {
          iVar16 = std::__cxx11::string::compare
                             ((ulong)local_1038,local_1038._8_8_ - (long)local_11f8.ptr_,
                              (string *)local_11f8.ptr_);
          bVar23 = iVar16 != 0;
        }
      }
      if ((!bVar2) && (local_1200 != local_11f0)) {
        operator_delete(local_1200,local_11f0[0] + 1);
      }
      if ((undefined1 *)local_1268._0_8_ != local_1268 + 0x10) {
        operator_delete((void *)local_1268._0_8_,local_1268._16_8_ + 1);
      }
      if (((bVar23) && ((string *)local_1038._8_8_ != (string *)0x0)) &&
         (((char *)(local_1038._0_8_ + -1))[local_1038._8_8_] != '/')) {
        std::__cxx11::string::push_back((char)(key_type *)local_1038);
      }
      ppGVar10 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_11e0,(key_type *)local_1038);
      if (*ppGVar10 == (mapped_type)0x0) {
        pGVar11 = (mapped_type)operator_new(0x48);
        (pGVar11->super_GeneratorContext)._vptr_GeneratorContext =
             (_func_int **)&PTR__GeneratorContextImpl_00425c60;
        p_Var13 = &(pGVar11->files_)._M_t._M_impl.super__Rb_tree_header;
        (pGVar11->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (pGVar11->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (pGVar11->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var13->_M_header
        ;
        (pGVar11->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var13->_M_header;
        (pGVar11->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pGVar11->parsed_files_ = &local_1288;
        pGVar11->had_error_ = false;
        *ppGVar10 = pGVar11;
      }
      bVar2 = GenerateOutput(this,&local_1288,
                             (OutputDirective *)
                             ((long)&(((this->output_directives_).
                                       super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus
                                     ._M_p + lVar5),&(*ppGVar10)->super_GeneratorContext);
      if (!bVar2) {
        STLDeleteValues<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*>>>>
                  ((hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                    *)&local_11e0);
        if ((undefined1 *)local_1038._0_8_ != local_1038 + 0x10) {
          operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
        }
        goto LAB_0020538e;
      }
      if ((undefined1 *)local_1038._0_8_ != local_1038 + 0x10) {
        operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
      }
      uVar20 = uVar20 + 1;
      pOVar9 = (this->output_directives_).
               super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(this->output_directives_).
                      super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar9 >> 3) *
               0x4ec4ec4ec4ec4ec5;
      lVar5 = lVar5 + 0x68;
    } while (uVar20 <= uVar14 && uVar14 - uVar20 != 0);
  }
  if (local_11e0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    pcVar1 = local_1038 + 0x10;
    _Var21._M_nxt = local_11e0._M_before_begin._M_nxt;
    do {
      this_01 = (GeneratorContextImpl *)_Var21._M_nxt[5]._M_nxt;
      local_1038._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"/","");
      filename = (string *)(_Var21._M_nxt + 1);
      if ((string *)_Var21._M_nxt[2]._M_nxt < (ulong)local_1038._8_8_) {
        bVar2 = false;
      }
      else {
        iVar16 = std::__cxx11::string::compare
                           ((ulong)filename,(long)_Var21._M_nxt[2]._M_nxt - local_1038._8_8_,
                            (string *)local_1038._8_8_);
        bVar2 = iVar16 == 0;
      }
      if ((char *)local_1038._0_8_ != pcVar1) {
        operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
      }
      if (bVar2) {
        bVar2 = GeneratorContextImpl::WriteAllToDisk(this_01,filename);
      }
      else {
        local_1038._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,".jar","");
        if (_Var21._M_nxt[2]._M_nxt < (ulong)local_1038._8_8_) {
          bVar2 = false;
        }
        else {
          iVar16 = std::__cxx11::string::compare
                             ((ulong)filename,(long)_Var21._M_nxt[2]._M_nxt - local_1038._8_8_,
                              (string *)local_1038._8_8_);
          bVar2 = iVar16 == 0;
        }
        if ((char *)local_1038._0_8_ != pcVar1) {
          operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
        }
        if (bVar2) {
          GeneratorContextImpl::AddJarManifest(this_01);
        }
        bVar2 = GeneratorContextImpl::WriteAllToZip(this_01,filename);
      }
      if (bVar2 == false) {
        STLDeleteValues<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*>>>>
                  ((hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                    *)&local_11e0);
        goto LAB_0020538e;
      }
      _Var21._M_nxt = (_Var21._M_nxt)->_M_nxt;
    } while (_Var21._M_nxt != (_Hash_node_base *)0x0);
  }
  if ((this->dependency_out_name_)._M_string_length != 0) {
    bVar2 = GenerateDependencyManifestFile
                      (this,&local_1288,(GeneratorContextMap *)&local_11e0,&local_10b0);
    iVar16 = 1;
    if (bVar2) goto LAB_00205036;
    goto LAB_0020551e;
  }
LAB_00205036:
  STLDeleteValues<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*>>>>
            ((hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
              *)&local_11e0);
  if ((this->descriptor_set_name_)._M_string_length != 0) {
    bVar2 = WriteDescriptorSet(this,&local_1288);
    iVar16 = 1;
    if (!bVar2) goto LAB_0020551e;
  }
  if (this->mode_ - MODE_ENCODE < 2) {
    if ((this->codec_type_)._M_string_length == 0) {
      DescriptorPool::DescriptorPool((DescriptorPool *)local_1268);
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_1038);
      FileDescriptorProto::set_name((FileDescriptorProto *)local_1038,"empty_message.proto");
      this_02 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                          ((RepeatedPtrFieldBase *)local_1008,(Type *)0x0);
      DescriptorProto::set_name(this_02,"EmptyMessage");
      pFVar6 = DescriptorPool::BuildFile
                         ((DescriptorPool *)local_1268,(FileDescriptorProto *)local_1038);
      if (pFVar6 == (FileDescriptor *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_1070,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                   ,0x387);
        pLVar12 = internal::LogMessage::operator<<
                            (&local_1070,"CHECK failed: pool.BuildFile(file) != NULL: ");
        internal::LogFinisher::operator=(&local_1289,pLVar12);
        internal::LogMessage::~LogMessage(&local_1070);
      }
      std::__cxx11::string::operator=((string *)&this->codec_type_,"EmptyMessage");
      bVar2 = EncodeOrDecode(this,(DescriptorPool *)local_1268);
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1038);
      DescriptorPool::~DescriptorPool((DescriptorPool *)local_1268);
      iVar16 = 1;
      if (bVar2) goto LAB_00205492;
    }
    else {
      bVar2 = EncodeOrDecode(this,&local_1118);
      iVar16 = 1;
      if (bVar2) goto LAB_00205492;
    }
  }
  else {
LAB_00205492:
    iVar16 = 1;
    if ((local_1180 == '\0') && (iVar16 = 0, this->mode_ == MODE_PRINT)) {
      if (this->print_mode_ == PRINT_NONE) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_1038,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                   ,0x3a2);
        pLVar12 = internal::LogMessage::operator<<
                            ((LogMessage *)local_1038,
                             "If the code reaches here, it usually means a bug of flag parsing in the CommonadLineInterface."
                            );
        internal::LogFinisher::operator=((LogFinisher *)local_1268,pLVar12);
        internal::LogMessage::~LogMessage((LogMessage *)local_1038);
LAB_0020538e:
        iVar16 = 1;
      }
      else if ((this->print_mode_ == PRINT_FREE_FIELDS) &&
              (local_1288.
               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               local_1288.
               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start)) {
        uVar20 = 0;
        iVar16 = 0;
        do {
          pFVar6 = local_1288.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar20];
          if (0 < *(int *)(pFVar6 + 0x58)) {
            lVar22 = 0;
            lVar5 = 0;
            do {
              PrintFreeFieldNumbers(this,(Descriptor *)(*(long *)(pFVar6 + 0x60) + lVar22));
              lVar5 = lVar5 + 1;
              lVar22 = lVar22 + 0xa8;
            } while (lVar5 < *(int *)(pFVar6 + 0x58));
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 < (ulong)((long)local_1288.
                                        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1288.
                                        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
  }
LAB_0020551e:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_11e0);
LAB_0020552b:
  if (local_1288.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (FileDescriptor **)0x0) {
    operator_delete(local_1288.
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1288.
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1288.
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Importer::~Importer((Importer *)local_1178);
  io::ErrorCollector::~ErrorCollector(&local_1198);
  MultiFileErrorCollector::~MultiFileErrorCollector(&local_11a0);
LAB_00205569:
  DiskSourceTree::~DiskSourceTree(&local_10b0);
  return iVar16;
}

Assistant:

int CommandLineInterface::Run(int argc, const char* const argv[]) {
  Clear();
  switch (ParseArguments(argc, argv)) {
    case PARSE_ARGUMENT_DONE_AND_EXIT:
      return 0;
    case PARSE_ARGUMENT_FAIL:
      return 1;
    case PARSE_ARGUMENT_DONE_AND_CONTINUE:
      break;
  }

  AddDefaultProtoPaths(&proto_path_);

  // Set up the source tree.
  DiskSourceTree source_tree;
  for (int i = 0; i < proto_path_.size(); i++) {
    source_tree.MapPath(proto_path_[i].first, proto_path_[i].second);
  }

  // Map input files to virtual paths if necessary.
  if (!inputs_are_proto_path_relative_) {
    if (!MakeInputsBeProtoPathRelative(&source_tree)) {
      return 1;
    }
  }

  // Allocate the Importer.
  ErrorPrinter error_collector(error_format_, &source_tree);
  Importer importer(&source_tree, &error_collector);

  std::vector<const FileDescriptor*> parsed_files;

  // Parse each file.
  for (int i = 0; i < input_files_.size(); i++) {
    // Import the file.
    importer.AddUnusedImportTrackFile(input_files_[i]);
    const FileDescriptor* parsed_file = importer.Import(input_files_[i]);
    importer.ClearUnusedImportTrackFiles();
    if (parsed_file == NULL) return 1;
    parsed_files.push_back(parsed_file);

    // Enforce --disallow_services.
    if (disallow_services_ && parsed_file->service_count() > 0) {
      cerr << parsed_file->name() << ": This file contains services, but "
              "--disallow_services was used." << endl;
      return 1;
    }

    // Enforce --direct_dependencies
    if (direct_dependencies_explicitly_set_) {
      bool indirect_imports = false;
      for (int i = 0; i < parsed_file->dependency_count(); i++) {
        if (direct_dependencies_.find(parsed_file->dependency(i)->name()) ==
            direct_dependencies_.end()) {
          indirect_imports = true;
          std::cerr << parsed_file->name() << ": "
                    << StringReplace(direct_dependencies_violation_msg_, "%s",
                                     parsed_file->dependency(i)->name(),
                                     true /* replace_all */)
                    << std::endl;
        }
      }
      if (indirect_imports) {
        return 1;
      }
    }
  }

  // We construct a separate GeneratorContext for each output location.  Note
  // that two code generators may output to the same location, in which case
  // they should share a single GeneratorContext so that OpenForInsert() works.
  GeneratorContextMap output_directories;

  // Generate output.
  if (mode_ == MODE_COMPILE) {
    for (int i = 0; i < output_directives_.size(); i++) {
      string output_location = output_directives_[i].output_location;
      if (!HasSuffixString(output_location, ".zip") &&
          !HasSuffixString(output_location, ".jar")) {
        AddTrailingSlash(&output_location);
      }
      GeneratorContextImpl** map_slot = &output_directories[output_location];

      if (*map_slot == NULL) {
        // First time we've seen this output location.
        *map_slot = new GeneratorContextImpl(parsed_files);
      }

      if (!GenerateOutput(parsed_files, output_directives_[i], *map_slot)) {
        STLDeleteValues(&output_directories);
        return 1;
      }
    }
  }

  // Write all output to disk.
  for (GeneratorContextMap::iterator iter = output_directories.begin();
       iter != output_directories.end(); ++iter) {
    const string& location = iter->first;
    GeneratorContextImpl* directory = iter->second;
    if (HasSuffixString(location, "/")) {
      if (!directory->WriteAllToDisk(location)) {
        STLDeleteValues(&output_directories);
        return 1;
      }
    } else {
      if (HasSuffixString(location, ".jar")) {
        directory->AddJarManifest();
      }

      if (!directory->WriteAllToZip(location)) {
        STLDeleteValues(&output_directories);
        return 1;
      }
    }
  }

  if (!dependency_out_name_.empty()) {
    if (!GenerateDependencyManifestFile(parsed_files, output_directories,
                                        &source_tree)) {
      return 1;
    }
  }

  STLDeleteValues(&output_directories);

  if (!descriptor_set_name_.empty()) {
    if (!WriteDescriptorSet(parsed_files)) {
      return 1;
    }
  }

  if (mode_ == MODE_ENCODE || mode_ == MODE_DECODE) {
    if (codec_type_.empty()) {
      // HACK:  Define an EmptyMessage type to use for decoding.
      DescriptorPool pool;
      FileDescriptorProto file;
      file.set_name("empty_message.proto");
      file.add_message_type()->set_name("EmptyMessage");
      GOOGLE_CHECK(pool.BuildFile(file) != NULL);
      codec_type_ = "EmptyMessage";
      if (!EncodeOrDecode(&pool)) {
        return 1;
      }
    } else {
      if (!EncodeOrDecode(importer.pool())) {
        return 1;
      }
    }
  }

  if (error_collector.FoundErrors()) {
    return 1;
  }

  if (mode_ == MODE_PRINT) {
    switch (print_mode_) {
      case PRINT_FREE_FIELDS:
        for (int i = 0; i < parsed_files.size(); ++i) {
          const FileDescriptor* fd = parsed_files[i];
          for (int j = 0; j < fd->message_type_count(); ++j) {
            PrintFreeFieldNumbers(fd->message_type(j));
          }
        }
        break;
      case PRINT_NONE:
        GOOGLE_LOG(ERROR) << "If the code reaches here, it usually means a bug of "
                     "flag parsing in the CommonadLineInterface.";
        return 1;

      // Do not add a default case.
    }
  }

  return 0;
}